

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_paste_replace(_glist *x)

{
  t_symbol *ptVar1;
  int iVar2;
  int dy_00;
  int iVar3;
  _glist *x_00;
  t_object *ptVar4;
  t_symbol *ptVar5;
  _glist *p_Var6;
  t_selection *ptVar7;
  void *pvVar8;
  t_gobj *y_00;
  t_selection *next;
  int dy;
  int dx;
  t_object *o;
  t_object *obj;
  t_selection *sel;
  t_symbol *s;
  t_symbol *seltype;
  t_selection *y;
  t_selection *mysel;
  _glist *canvas;
  t_symbol *typ0;
  int y0;
  int x0;
  _glist *x_local;
  
  typ0._4_4_ = 0;
  typ0._0_4_ = 0;
  canvas = (_glist *)0x0;
  if (((x->gl_editor != (t_editor *)0x0) && (x->gl_editor->e_selection != (t_selection *)0x0)) &&
     (_y0 = x, iVar2 = binbuf_getpos(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor,
                                     (int *)((long)&typ0 + 4),(int *)&typ0,(t_symbol **)&canvas),
     iVar2 == 1)) {
    x_00 = glist_getcanvas(_y0);
    y = (t_selection *)0x0;
    s = (t_symbol *)0x0;
    for (seltype = (t_symbol *)_y0->gl_editor->e_selection; seltype != (t_symbol *)0x0;
        seltype = (t_symbol *)seltype->s_thing) {
      ptVar4 = pd_checkobject((t_pd *)seltype->s_name);
      ptVar5 = get_object_type(ptVar4);
      ptVar1 = s;
      if (((ptVar5 != (t_symbol *)0x0) && (ptVar1 = ptVar5, s != (t_symbol *)0x0)) && (s != ptVar5))
      {
        s = (t_symbol *)0x0;
        break;
      }
      s = ptVar1;
    }
    for (seltype = (t_symbol *)_y0->gl_editor->e_selection; seltype != (t_symbol *)0x0;
        seltype = (t_symbol *)seltype->s_thing) {
      ptVar4 = pd_checkobject((t_pd *)seltype->s_name);
      if ((ptVar4 != (t_object *)0x0) &&
         ((s != (t_symbol *)0x0 || (p_Var6 = (_glist *)get_object_type(ptVar4), p_Var6 == canvas))))
      {
        ptVar7 = (t_selection *)getbytes(0x10);
        ptVar7->sel_what = (t_gobj *)seltype->s_name;
        ptVar7->sel_next = y;
        y = ptVar7;
      }
    }
    canvas_undo_add(_y0,UNDO_SEQUENCE_START,"paste/replace",(void *)0x0);
    for (seltype = (t_symbol *)y; seltype != (t_symbol *)0x0; seltype = (t_symbol *)seltype->s_thing
        ) {
      iVar2 = *(short *)(seltype->s_name + 0x28) - typ0._4_4_;
      dy_00 = *(short *)(seltype->s_name + 0x2a) - (int)typ0;
      glist_noselect(_y0);
      p_Var6 = _y0;
      *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 0;
      pvVar8 = canvas_undo_set_arrange(_y0,(t_gobj *)seltype->s_name,1);
      canvas_undo_add(p_Var6,UNDO_ARRANGE,"arrange",pvVar8);
      canvas_stowconnections(x_00);
      p_Var6 = _y0;
      pvVar8 = canvas_undo_set_cut(_y0,2);
      canvas_undo_add(p_Var6,UNDO_CUT,"clear",pvVar8);
      canvas_doclear(_y0);
      canvas_applybinbuf(_y0,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
      glist_noselect(_y0);
      p_Var6 = _y0;
      iVar3 = glist_getindex(_y0,(t_gobj *)0x0);
      y_00 = glist_nth(p_Var6,iVar3 + -1);
      glist_select(p_Var6,y_00);
      canvas_displaceselection(_y0,iVar2,dy_00);
      canvas_restoreconnections(x_00);
      p_Var6 = _y0;
      pvVar8 = canvas_undo_set_create(_y0);
      canvas_undo_add(p_Var6,UNDO_CREATE,"create",pvVar8);
      if ((pd_maininstance.pd_newest != (t_pd *)0x0) && (*pd_maininstance.pd_newest == canvas_class)
         ) {
        canvas_loadbang((_glist *)pd_maininstance.pd_newest);
      }
    }
    canvas_undo_add(_y0,UNDO_SEQUENCE_END,"paste/replace",(void *)0x0);
    seltype = (t_symbol *)y;
    while (seltype != (t_symbol *)0x0) {
      ptVar1 = (t_symbol *)seltype->s_thing;
      freebytes(seltype,0x10);
      seltype = ptVar1;
    }
  }
  return;
}

Assistant:

static void canvas_paste_replace(t_canvas *x)
{
    int x0=0, y0=0;
    t_symbol *typ0 = 0;
    if (!x->gl_editor)
        return;
    if(x->gl_editor->e_selection && 1==binbuf_getpos(EDITOR->copy_binbuf, &x0, &y0, &typ0))
    {
        t_canvas *canvas = glist_getcanvas(x);
        t_selection *mysel = 0, *y;
        t_symbol *seltype = 0;

            /* check whether all the selected objects have the same type */
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
        {
            t_symbol *s=get_object_type(pd_checkobject(&y->sel_what->g_pd));
            if (!s)
                continue;
            if(seltype && seltype != s)
            {
                seltype = 0;
                break;
            }
            seltype = s;
        }

            /* we will do a lot of reslecting; so copy the selection */
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
        {
            t_selection *sel = 0;
            t_object *obj=pd_checkobject(&y->sel_what->g_pd);
            if(!obj)
               continue;
                    /* if the selection mixes obj, msg,... we only want to
                     * replace the same type;
                     * if the selection is homogeneous (seltype==NULL), we also allow typechanges
                     */
            if (!seltype && get_object_type(obj) != typ0)
                continue;
            sel = (t_selection *)getbytes(sizeof(*sel));
            sel->sel_what = y->sel_what;
            sel->sel_next = mysel;
            mysel = sel;
        }

        canvas_undo_add(x, UNDO_SEQUENCE_START, "paste/replace", 0);

        for (y = mysel; y; y = y->sel_next)
        {
            t_object *o = (t_object *)(&y->sel_what->g_pd);
            int dx = o->te_xpix - x0;
            int dy = o->te_ypix - y0;
            glist_noselect(x);
            EDITOR->canvas_undo_already_set_move = 0;
                /* save connections and move object to the end */
                /* note: the undo sequence selects the object as a side-effect */
            canvas_undo_add(x, UNDO_ARRANGE, "arrange",
                canvas_undo_set_arrange(x, y->sel_what, 1));
            canvas_stowconnections(canvas);
                /* recreate object */
                /* remove the old object */
            canvas_undo_add(x, UNDO_CUT, "clear",
                canvas_undo_set_cut(x, UCUT_CLEAR));
            canvas_doclear(x);

                /* create the new object (and loadbang if needed) */
            canvas_applybinbuf(x, EDITOR->copy_binbuf);

            glist_noselect(x);
            glist_select(x, glist_nth(x, glist_getindex(x, 0) - 1));
                /* displace object (includes UNDO) */
            canvas_displaceselection(x, dx, dy);
                /* restore connections */
            canvas_restoreconnections(canvas);

            canvas_undo_add(x, UNDO_CREATE, "create",
                (void *)canvas_undo_set_create(x));

            if (pd_this->pd_newest && pd_class(pd_this->pd_newest) == canvas_class)
                canvas_loadbang((t_canvas *)pd_this->pd_newest);
        }
        canvas_undo_add(x, UNDO_SEQUENCE_END, "paste/replace", 0);

            /* free the selection copy */
        for (y = mysel; y; )
        {
            t_selection*next = y->sel_next;
            freebytes(y, sizeof(*y));
            y = next;
        }

    }
}